

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2DataBuilder::setUnicodeVersion(Normalizer2DataBuilder *this,char *v)

{
  UVersionInfo version;
  char buffer [20];
  
  u_versionFromString_63(version,v);
  if ((version != *&this->unicodeVersion) && (*&this->unicodeVersion != (UVersionInfo)0x0)) {
    u_versionToString_63(this->unicodeVersion,buffer);
    fprintf(_stderr,"gennorm2 error: multiple inconsistent Unicode version numbers %s vs. %s\n",
            buffer,v);
    exit(1);
  }
  *&this->unicodeVersion = version;
  return;
}

Assistant:

void
Normalizer2DataBuilder::setUnicodeVersion(const char *v) {
    UVersionInfo nullVersion={ 0, 0, 0, 0 };
    UVersionInfo version;
    u_versionFromString(version, v);
    if( 0!=memcmp(version, unicodeVersion, U_MAX_VERSION_LENGTH) &&
        0!=memcmp(nullVersion, unicodeVersion, U_MAX_VERSION_LENGTH)
    ) {
        char buffer[U_MAX_VERSION_STRING_LENGTH];
        u_versionToString(unicodeVersion, buffer);
        fprintf(stderr, "gennorm2 error: multiple inconsistent Unicode version numbers %s vs. %s\n",
                buffer, v);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }
    memcpy(unicodeVersion, version, U_MAX_VERSION_LENGTH);
}